

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O1

Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_> *
wasm::WATParser::anon_unknown_21::wastModule
          (Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>
           *__return_storage_ptr__,Lexer *in,bool maybeInvalid)

{
  ulong *puVar1;
  _Alloc_hider _Var2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  undefined1 uVar6;
  ulong uVar7;
  int iVar8;
  _Alloc_hider _Var9;
  int iVar10;
  bool bVar11;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  undefined1 local_2d0 [8];
  optional<wasm::Name> id;
  stringstream ss;
  ulong local_2a8;
  undefined1 uStack_2a0;
  undefined7 uStack_29f;
  char cStack_298;
  undefined7 uStack_297;
  ios_base local_238 [264];
  size_t local_130;
  Lexer reset;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  string local_98;
  Module *pMStack_78;
  shared_ptr<wasm::Module> wasm;
  undefined4 local_5c;
  undefined1 local_58 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> s;
  
  local_130 = in->pos;
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
            ((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
             &reset,&in->annotations);
  reset.file.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0;
  bVar11 = (in->file).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_engaged == true;
  if (bVar11) {
    reset.annotations.
    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&reset.file.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 8);
    _Var9._M_p = (in->file).
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               &reset.annotations.
                super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,_Var9._M_p,
               _Var9._M_p +
               (in->file).
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length);
  }
  reset.file.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = (in->buffer)._M_len;
  reset.buffer._M_len = (size_t)(in->buffer)._M_str;
  expected._M_str = "module";
  expected._M_len = 6;
  reset.file.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = bVar11;
  bVar11 = Lexer::takeSExprStart(in,expected);
  if (bVar11) {
    Lexer::takeID((optional<wasm::Name> *)local_2d0,in);
    expected_00._M_str = "quote";
    expected_00._M_len = 5;
    bVar11 = Lexer::takeKeyword(in,expected_00);
    local_5c = 0;
    if (!bVar11) {
      expected_01._M_str = "binary";
      expected_01._M_len = 6;
      bVar11 = Lexer::takeKeyword(in,expected_01);
      local_5c = 1;
      if (!bVar11) {
        if (!maybeInvalid) {
          in->pos = local_130;
          wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
          std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
          _M_move_assign(&in->annotations,&reset);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&in->file,
                           (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&reset.annotations.
                               super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          (in->buffer)._M_len =
               reset.file.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._32_8_;
          (in->buffer)._M_str = (char *)reset.buffer._M_len;
          pMStack_78 = (Module *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<wasm::Module,std::allocator<wasm::Module>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&wasm,&pMStack_78,
                     (_Sp_alloc_shared_tag<std::allocator<wasm::Module>_>)
                     &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._M_engaged);
          parseModule((Result<wasm::Ok> *)
                      &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,pMStack_78,in);
          __return_storage_ptr__ =
               (Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>
                *)wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          if (cStack_298 == '\x01') {
            _Var9._M_p = (pointer)((long)&s.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._M_payload + 8);
            local_58 = (undefined1  [8])_Var9._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_58,
                       id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._16_8_,
                       _ss + id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::Name>._16_8_);
            __return_storage_ptr__ =
                 (Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>
                  *)wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            (wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base =
                 (_func_int **)
                 (wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi + 1);
            if (local_58 == (undefined1  [8])_Var9._M_p) {
              wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
              ._vptr__Sp_counted_base =
                   (_func_int **)
                   s.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_string_length;
              wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
              ._M_use_count =
                   (int)CONCAT71(s.
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload._17_7_,
                                 s.
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload._16_1_);
              wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
              ._M_weak_count =
                   (int)((uint7)s.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._17_7_ >> 0x18);
            }
            else {
              (wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ->_vptr__Sp_counted_base = (_func_int **)local_58;
              wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
              ._vptr__Sp_counted_base =
                   (_func_int **)
                   s.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_string_length;
            }
            *(_Alloc_hider *)
             &(wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ->_M_use_count =
                 s.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
            s.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
            s.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length =
                 s.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
            *(undefined1 *)
             &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3]
              ._vptr__Sp_counted_base = 1;
            local_58 = (undefined1  [8])_Var9._M_p;
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_engaged);
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_engaged);
            peVar5 = wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->_M_use_count =
                 0;
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->_M_weak_count
                 = 0;
            wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
            _vptr__Sp_counted_base = (_func_int **)pMStack_78;
            *(element_type **)
             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->_M_use_count
                 = peVar5;
            pMStack_78 = (Module *)0x0;
            *(undefined1 *)
             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)__return_storage_ptr__ + 0x20)
              )->_M_use_count = 1;
            *(undefined1 *)
             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)__return_storage_ptr__ + 0x30)
              )->_vptr__Sp_counted_base = 0;
          }
          if (wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          goto LAB_00c31a9c;
        }
        iVar10 = 1;
        do {
          bVar11 = Lexer::takeUntilParen(in);
          if (!bVar11) break;
          bVar11 = Lexer::takeLParen(in);
          iVar8 = 1;
          if (!bVar11) {
            bVar11 = Lexer::takeRParen(in);
            iVar8 = -1;
            if (!bVar11) {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,"unexpected end of script","");
              Lexer::err((Err *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                                 super__Optional_payload_base<wasm::Name>._M_engaged,in,&local_b8);
              puVar1 = (ulong *)((long)&(__return_storage_ptr__->val).
                                        super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                        .
                                        super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                        .
                                        super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                + 0x10);
              *(ulong **)
               &(__return_storage_ptr__->val).
                super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                .
                super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                .
                super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                .
                super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                .
                super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                .
                super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                   = puVar1;
              if ((ulong *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._16_8_ == &local_2a8) {
                *puVar1 = local_2a8;
                *(ulong *)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                  .
                                  super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                          + 0x18) = CONCAT71(uStack_29f,uStack_2a0);
              }
              else {
                *(undefined8 *)
                 &(__return_storage_ptr__->val).
                  super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._16_8_;
                *(ulong *)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                                  .
                                  super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                          + 0x10) = local_2a8;
              }
              *(undefined1 **)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
               + 8) = _ss;
              _ss = (undefined1 *)0x0;
              local_2a8 = local_2a8 & 0xffffffffffffff00;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
               + 0x30) = '\x01';
              local_c8._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
              _Var9._M_p = local_b8._M_dataplus._M_p;
              id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._16_8_ = &local_2a8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_00c318c5;
              goto LAB_00c31a9c;
            }
          }
          iVar10 = iVar10 + iVar8;
        } while (iVar10 != 0);
        if ((ulong)reset.file.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._32_8_ < local_130) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr")
          ;
        }
        uVar7 = in->pos - local_130;
        if (reset.file.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_8_ - local_130 < uVar7) {
          uVar7 = reset.file.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._32_8_ - local_130;
        }
        _Var2._M_p = (pointer)((long)&s.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload + 8);
        local_58 = (undefined1  [8])_Var2._M_p;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,reset.buffer._M_len + local_130,
                   uVar7 + reset.buffer._M_len + local_130);
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._16_8_ =
             (ulong)(uint)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::Name>._20_4_ << 0x20;
        _ss = &uStack_2a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&ss,local_58,
                   (undefined1 *)
                   ((long)s.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_dataplus._M_p + (long)local_58));
        *(undefined4 *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_4_;
        puVar3 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 + 0x18);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
         + 8) = puVar3;
        if (_ss == &uStack_2a0) {
          *puVar3 = CONCAT71(uStack_29f,uStack_2a0);
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                            .
                            super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                    + 0x20) = CONCAT71(uStack_297,cStack_298);
        }
        else {
          *(undefined1 **)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
           + 8) = _ss;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                            .
                            super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                    + 0x18) = CONCAT71(uStack_29f,uStack_2a0);
        }
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                  + 0x10) = local_2a8;
        local_2a8 = 0;
        uStack_2a0 = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
         + 0x28) = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
         + 0x30) = '\0';
        local_c8._M_allocated_capacity =
             s.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_string_length;
        _Var9._M_p = (pointer)local_58;
        _ss = &uStack_2a0;
        if (local_58 == (undefined1  [8])_Var2._M_p) goto LAB_00c31a9c;
        goto LAB_00c318c5;
      }
    }
    wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
    std::__cxx11::stringstream::stringstream
              ((stringstream *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    _Var9._M_p = (pointer)((long)&s.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + 8);
    do {
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_58,in);
      uVar6 = s.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._24_1_;
      if (s.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_1_ != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2a8,(char *)local_58,
                   (long)s.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_dataplus._M_p);
      }
      if ((s.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._24_1_ == '\x01') &&
         (s.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_1_ = 0, local_58 != (undefined1  [8])_Var9._M_p)) {
        operator_delete((void *)local_58,
                        s.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_string_length + 1);
      }
    } while (uVar6 != '\0');
    bVar11 = Lexer::takeRParen(in);
    __return_storage_ptr__ =
         (Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_> *)
         wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var4 = wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (bVar11) {
      local_58._0_4_ = local_5c;
      std::__cxx11::stringbuf::str();
      _Var9._M_p = (pointer)((long)&s.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload + 0x10);
      *(undefined4 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
        _vptr__Sp_counted_base = local_58._0_4_;
      *(_Atomic_word **)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->_M_use_count =
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)__return_storage_ptr__ + 0x10))
            ->_M_use_count;
      if (s.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p == (_Alloc_hider)_Var9._M_p) {
        p_Var4[1]._M_use_count =
             (int)CONCAT71(s.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._17_7_,
                           s.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._16_1_);
        p_Var4[1]._M_weak_count =
             (int)((uint7)s.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._17_7_ >> 0x18);
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)__return_storage_ptr__ + 0x20))->
        _vptr__Sp_counted_base =
             (_func_int **)
             CONCAT71(s.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._25_7_,
                      s.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._24_1_);
      }
      else {
        *(_Alloc_hider *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->_M_use_count =
             s.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_dataplus._M_p;
        p_Var4[1]._M_use_count =
             (int)CONCAT71(s.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._17_7_,
                           s.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._16_1_);
        p_Var4[1]._M_weak_count =
             (int)((uint7)s.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._17_7_ >> 0x18);
      }
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)__return_storage_ptr__ + 0x10))->
      _vptr__Sp_counted_base =
           (_func_int **)
           s.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length;
      s.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = 0;
      s.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._16_1_ = 0;
      *(undefined1 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)__return_storage_ptr__ + 0x20))->
        _M_use_count = 0;
      *(undefined1 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)__return_storage_ptr__ + 0x30))->
        _vptr__Sp_counted_base = 0;
      s.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var9._M_p;
    }
    else {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"expected end of module","");
      Lexer::err((Err *)local_58,in,&local_98);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
      _vptr__Sp_counted_base = (_func_int **)((long)__return_storage_ptr__ + 0x10);
      if (local_58 == (undefined1  [8])_Var9._M_p) {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)__return_storage_ptr__ + 0x10))->
        _vptr__Sp_counted_base =
             (_func_int **)
             s.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_string_length;
        p_Var4[1]._M_use_count =
             (int)CONCAT71(s.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._17_7_,
                           s.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._16_1_);
        p_Var4[1]._M_weak_count =
             (int)((uint7)s.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._17_7_ >> 0x18);
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
        _vptr__Sp_counted_base = (_func_int **)local_58;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)__return_storage_ptr__ + 0x10))->
        _vptr__Sp_counted_base =
             (_func_int **)
             s.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_string_length;
      }
      *(_Alloc_hider *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->_M_use_count =
           s.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_dataplus._M_p;
      s.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
      s.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length =
           s.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
      *(undefined1 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)__return_storage_ptr__ + 0x30))->
        _vptr__Sp_counted_base = 1;
      local_58 = (undefined1  [8])_Var9._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::ios_base::~ios_base(local_238);
  }
  else {
    reset.buffer._M_str = (char *)&local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&reset.buffer._M_str,"expected module","");
    Lexer::err((Err *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,in,
               (string *)&reset.buffer._M_str);
    puVar1 = (ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                              .
                              super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                      + 0x10);
    *(ulong **)
     &(__return_storage_ptr__->val).
      super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
         = puVar1;
    if ((ulong *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._16_8_ == &local_2a8) {
      *puVar1 = local_2a8;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                + 0x18) = CONCAT71(uStack_29f,uStack_2a0);
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
           = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                + 0x10) = local_2a8;
    }
    *(undefined1 **)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
     + 8) = _ss;
    _ss = (undefined1 *)0x0;
    local_2a8 = local_2a8 & 0xffffffffffffff00;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
     + 0x30) = '\x01';
    _Var9._M_p = reset.buffer._M_str;
    id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._16_8_ = &local_2a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)reset.buffer._M_str == &local_c8) goto LAB_00c31a9c;
LAB_00c318c5:
    operator_delete(_Var9._M_p,local_c8._M_allocated_capacity + 1);
  }
LAB_00c31a9c:
  if ((reset.file.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._24_1_ == '\x01') &&
     (reset.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ = 0,
     reset.annotations.
     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
     _M_impl.super__Vector_impl_data._M_end_of_storage !=
     (pointer)((long)&reset.file.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 8U))) {
    operator_delete(reset.annotations.
                    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    reset.file.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length + 1);
  }
  if (reset.pos != 0) {
    operator_delete((void *)reset.pos,
                    (long)reset.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_finish - reset.pos);
  }
  return (Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_> *)
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
}

Assistant:

Result<WASTModule> wastModule(Lexer& in, bool maybeInvalid = false) {
  Lexer reset = in;
  if (!in.takeSExprStart("module"sv)) {
    return in.err("expected module");
  }
  // TODO: use ID?
  [[maybe_unused]] auto id = in.takeID();
  QuotedModuleType type;
  if (in.takeKeyword("quote"sv)) {
    type = QuotedModuleType::Text;
  } else if (in.takeKeyword("binary")) {
    type = QuotedModuleType::Binary;
  } else if (maybeInvalid) {
    // This is not a quoted text or binary module, so it must be a normal inline
    // module, but we might not be able to parse it. Treat it as through it were
    // a quoted module instead.
    int count = 1;
    while (count && in.takeUntilParen()) {
      if (in.takeLParen()) {
        ++count;
      } else if (in.takeRParen()) {
        --count;
      } else {
        return in.err("unexpected end of script");
      }
    }
    std::string mod(reset.next().substr(0, in.getPos() - reset.getPos()));
    return QuotedModule{QuotedModuleType::Text, mod};
  } else {
    // This is a normal inline module that should be parseable. Reset to the
    // start and parse it normally.
    in = std::move(reset);
    auto wasm = std::make_shared<Module>();
    CHECK_ERR(parseModule(*wasm, in));
    return wasm;
  }

  // We have a quote or binary module. Collect its contents.
  std::stringstream ss;
  while (auto s = in.takeString()) {
    ss << *s;
  }

  if (!in.takeRParen()) {
    return in.err("expected end of module");
  }

  return QuotedModule{type, ss.str()};
}